

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS
ref_grid_tri_qua_id_nodes
          (REF_GRID ref_grid,REF_INT cell_id,REF_INT *nnode,REF_INT *ncell,REF_INT **g2l,
          REF_INT **l2g)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_STATUS RVar4;
  REF_INT *pRVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  REF_INT nodes [27];
  
  pRVar2 = ref_grid->node;
  uVar11 = (ulong)pRVar2->max;
  if ((long)uVar11 < 0) {
    pcVar9 = "malloc *g2l of REF_INT negative";
    uVar8 = 0x18a;
LAB_0011446f:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar8,
           "ref_grid_tri_qua_id_nodes",pcVar9);
    RVar4 = 1;
  }
  else {
    pRVar5 = (REF_INT *)malloc(uVar11 * 4);
    *g2l = pRVar5;
    if (pRVar5 == (REF_INT *)0x0) {
      pcVar9 = "malloc *g2l of REF_INT NULL";
      uVar8 = 0x18a;
    }
    else {
      for (uVar7 = 0; uVar7 < uVar11; uVar7 = uVar7 + 1) {
        pRVar5[uVar7] = -1;
      }
      *nnode = 0;
      *ncell = 0;
      pRVar3 = ref_grid->cell[3];
      for (iVar10 = 0; iVar10 < pRVar3->max; iVar10 = iVar10 + 1) {
        RVar4 = ref_cell_nodes(pRVar3,iVar10,nodes);
        if ((RVar4 == 0) && (nodes[pRVar3->node_per] == cell_id)) {
          *ncell = *ncell + 1;
          for (lVar6 = 0; lVar6 < pRVar3->node_per; lVar6 = lVar6 + 1) {
            if ((*g2l)[nodes[lVar6]] == -1) {
              iVar1 = *nnode;
              (*g2l)[nodes[lVar6]] = iVar1;
              *nnode = iVar1 + 1;
            }
          }
        }
      }
      pRVar3 = ref_grid->cell[6];
      for (iVar10 = 0; iVar10 < pRVar3->max; iVar10 = iVar10 + 1) {
        RVar4 = ref_cell_nodes(pRVar3,iVar10,nodes);
        if ((RVar4 == 0) && (nodes[pRVar3->node_per] == cell_id)) {
          *ncell = *ncell + 1;
          for (lVar6 = 0; lVar6 < pRVar3->node_per; lVar6 = lVar6 + 1) {
            if ((*g2l)[nodes[lVar6]] == -1) {
              iVar1 = *nnode;
              (*g2l)[nodes[lVar6]] = iVar1;
              *nnode = iVar1 + 1;
            }
          }
        }
      }
      if ((long)*nnode < 0) {
        pcVar9 = "malloc *l2g of REF_INT negative";
        uVar8 = 0x1a9;
        goto LAB_0011446f;
      }
      pRVar5 = (REF_INT *)malloc((long)*nnode << 2);
      *l2g = pRVar5;
      if (pRVar5 != (REF_INT *)0x0) {
        *nnode = 0;
        iVar10 = 0;
        for (lVar6 = 0; lVar6 < pRVar2->max; lVar6 = lVar6 + 1) {
          if ((*g2l)[lVar6] != -1) {
            (*g2l)[lVar6] = iVar10;
            iVar10 = *nnode;
            pRVar5[iVar10] = (REF_INT)lVar6;
            iVar10 = iVar10 + 1;
            *nnode = iVar10;
          }
        }
        return 0;
      }
      pcVar9 = "malloc *l2g of REF_INT NULL";
      uVar8 = 0x1a9;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar8,
           "ref_grid_tri_qua_id_nodes",pcVar9);
    RVar4 = 2;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_grid_tri_qua_id_nodes(REF_GRID ref_grid, REF_INT cell_id,
                                             REF_INT *nnode, REF_INT *ncell,
                                             REF_INT **g2l, REF_INT **l2g) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT cell, node, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_node = ref_grid_node(ref_grid);

  ref_malloc_init(*g2l, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  (*nnode) = 0;
  (*ncell) = 0;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_malloc(*l2g, *nnode, REF_INT);

  (*nnode) = 0;
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != (*g2l)[node]) {
      (*g2l)[node] = (*nnode);
      (*l2g)[(*nnode)] = node;
      (*nnode)++;
    }
  }

  return REF_SUCCESS;
}